

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_c9fea::ScaleBPM_ignored_interaction_Test::~ScaleBPM_ignored_interaction_Test
          (ScaleBPM_ignored_interaction_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ScaleBPM, ignored_interaction) {
   
   Polynomial<uint32_t, double> polynomial = GeneratePolynomialUINT();
   
   for (auto &&it: polynomial) {
      it.second *= 2;
   }
      
   BinaryPolynomialModel<uint32_t, double> bpm(polynomial, Vartype::SPIN);
   
   bpm.Scale(0.5, {{1,2}, {2, 4}, {1, 3, 4}});
   
   EXPECT_DOUBLE_EQ(bpm.GetPolynomial({1, 2}   ), 12.0*2 );
   EXPECT_DOUBLE_EQ(bpm.GetPolynomial({2, 4}   ), 24.0*2 );
   EXPECT_DOUBLE_EQ(bpm.GetPolynomial({1, 3, 4}), 134.0*2);

   bpm.AddInteraction({1, 2}   , -12.0);
   bpm.AddInteraction({2, 4}   , -24.0);
   bpm.AddInteraction({1, 3, 4}, -134.0);
   
   StateTestBPMUINT(bpm);

}